

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,char *str,char *str_end)

{
  ImU32 id_00;
  uint *puVar1;
  size_t data_size;
  long in_RDX;
  char *in_RSI;
  ImGuiID id;
  ImGuiID seed;
  ImVector<unsigned_int> *in_stack_ffffffffffffffd0;
  
  puVar1 = ImVector<unsigned_int>::back(in_stack_ffffffffffffffd0);
  if (in_RDX == 0) {
    data_size = 0;
  }
  else {
    data_size = in_RDX - (long)in_RSI;
  }
  id_00 = ImHashStr(in_RSI,data_size,*puVar1);
  ImGui::KeepAliveID(id_00);
  return id_00;
}

Assistant:

ImGuiID ImGuiWindow::GetID(const char* str, const char* str_end)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    ImGui::KeepAliveID(id);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO2(id, ImGuiDataType_String, str, str_end);
#endif
    return id;
}